

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int bcf_translate(bcf_hdr_t *dst_hdr,bcf_hdr_t *src_hdr,bcf1_t *line)

{
  int *piVar1;
  uint uVar2;
  char *__s2;
  int *piVar3;
  bcf_info_t *pbVar4;
  bcf_fmt_t *pbVar5;
  bool bVar6;
  int iVar7;
  int *piVar8;
  char *pcVar9;
  bcf_hdr_t *hdr;
  bcf_hdr_t *pbVar10;
  uint uVar11;
  bcf_idpair_t *pbVar12;
  ulong uVar13;
  undefined1 uVar14;
  void *pvVar15;
  long lVar16;
  size_t sVar17;
  bcf1_t *pbVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  kstring_t str;
  kstring_t local_78;
  void *local_60;
  bcf1_t *local_58;
  bcf_hdr_t *local_50;
  uint local_44;
  bcf_hdr_t *local_40;
  bcf_idpair_t *local_38;
  
  pbVar10 = (bcf_hdr_t *)(ulong)(uint)line->errcode;
  if (line->errcode != 0) {
    bcf_translate_cold_1();
    hdr = bcf_hdr_init("r");
    pcVar9 = bcf_hdr_fmt_text(pbVar10,1,(int *)0x0);
    bcf_hdr_parse(hdr,pcVar9);
    free(pcVar9);
    return (int)hdr;
  }
  if (src_hdr->ntransl == -1) {
    return 0;
  }
  local_58 = line;
  if (src_hdr->ntransl == 0) {
    local_60 = (void *)0x0;
    lVar16 = 0;
    local_50 = dst_hdr;
    local_40 = src_hdr;
    uVar11 = 1;
    do {
      local_44 = uVar11;
      pbVar10 = local_40;
      uVar13 = (ulong)local_40->n[lVar16];
      piVar8 = (int *)malloc(uVar13 * 4);
      pbVar10->transl[lVar16] = piVar8;
      if (0 < (long)uVar13) {
        pbVar12 = pbVar10->id[lVar16];
        lVar21 = 0;
        lVar19 = 0;
        pbVar10 = local_50;
        local_38 = pbVar12;
        do {
          pcVar9 = *(char **)((long)&pbVar12->key + lVar21);
          if ((pcVar9 == (char *)0x0) ||
             (__s2 = *(char **)((long)&pbVar10->id[lVar16]->key + lVar21), __s2 == (char *)0x0)) {
            piVar8[lVar19] = -1;
          }
          else if ((lVar19 < pbVar10->n[lVar16]) &&
                  (iVar7 = strcmp(pcVar9,__s2), pbVar10 = local_50, iVar7 == 0)) {
            piVar8[lVar19] = -1;
            pbVar12 = local_38;
          }
          else {
            iVar7 = bcf_hdr_id2int(pbVar10,(int)lVar16,pcVar9);
            piVar8[lVar19] = iVar7;
            uVar11 = (int)local_60 + 1;
            local_60 = (void *)(ulong)uVar11;
            local_40->ntransl = uVar11;
            uVar13 = (ulong)(uint)local_40->n[lVar16];
            pbVar10 = local_50;
            pbVar12 = local_38;
          }
          lVar19 = lVar19 + 1;
          lVar21 = lVar21 + 0x10;
        } while (lVar19 < (int)uVar13);
      }
      pbVar10 = local_40;
      lVar16 = 1;
      uVar11 = 0;
    } while ((local_44 & 1) != 0);
    if ((int)local_60 == -1) {
      return 0;
    }
    src_hdr = local_40;
    if ((int)local_60 == 0) {
      free(local_40->transl[0]);
      pbVar10->transl[0] = (int *)0x0;
      free(pbVar10->transl[1]);
      pbVar10->transl[1] = (int *)0x0;
      pbVar10->ntransl = -1;
      return 0;
    }
  }
  pbVar18 = local_58;
  bcf_unpack(local_58,0xf);
  if (-1 < src_hdr->transl[1][pbVar18->rid]) {
    pbVar18->rid = src_hdr->transl[1][pbVar18->rid];
  }
  iVar7 = (pbVar18->d).n_flt;
  if (0 < iVar7) {
    piVar8 = (pbVar18->d).flt;
    piVar3 = src_hdr->transl[0];
    lVar16 = 0;
    do {
      if (-1 < piVar3[piVar8[lVar16]]) {
        piVar8[lVar16] = piVar3[piVar8[lVar16]];
        iVar7 = (pbVar18->d).n_flt;
      }
      piVar1 = &(pbVar18->d).shared_dirty;
      *(byte *)piVar1 = (byte)*piVar1 | 4;
      lVar16 = lVar16 + 1;
    } while (lVar16 < iVar7);
  }
  uVar13 = *(ulong *)&pbVar18->field_0x10;
  if ((short)uVar13 != 0) {
    lVar16 = 0x1c;
    uVar20 = 0;
    do {
      pbVar4 = (pbVar18->d).info;
      uVar11 = *(uint *)((long)pbVar4 + lVar16 + -0x1c);
      uVar2 = src_hdr->transl[0][(int)uVar11];
      if (-1 < (int)uVar2) {
        iVar7 = 3 - (uint)(uVar2 < 0x8000);
        if (uVar2 < 0x80) {
          iVar7 = 1;
        }
        bVar6 = uVar2 < 0x80;
        if (0x7f < uVar11) {
          bVar6 = 3 - (uint)(uVar11 < 0x8000) == iVar7;
        }
        if (bVar6) {
          *(uint *)((long)pbVar4 + lVar16 + -0x1c) = uVar2;
          lVar19 = *(long *)((long)pbVar4 + lVar16 + -0xc);
          lVar21 = -(ulong)(*(uint *)((long)&pbVar4->key + lVar16) & 0x7fffffff);
          if (iVar7 == 2) {
            *(short *)(lVar19 + lVar21) = (short)uVar2;
          }
          else if (iVar7 == 1) {
            *(char *)(lVar19 + 1 + lVar21) = (char)uVar2;
          }
          else {
            *(uint *)(lVar19 + lVar21) = uVar2;
          }
        }
        else {
          if (*(int *)((long)&pbVar4->key + lVar16) < 0) {
            __assert_fail("!info->vptr_free",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                          ,0x926,"int bcf_translate(const bcf_hdr_t *, bcf_hdr_t *, bcf1_t *)");
          }
          local_78.l = 0;
          local_78.m = 0;
          local_78.s = (char *)0x0;
          bcf_enc_int1(&local_78,uVar2);
          bcf_enc_size(&local_78,*(int *)((long)pbVar4 + lVar16 + -0x14),
                       *(int *)((long)pbVar4 + lVar16 + -0x18));
          *(uint *)((long)&pbVar4->key + lVar16) =
               *(uint *)((long)&pbVar4->key + lVar16) & 0x80000000 | (uint)local_78.l & 0x7fffffff;
          pvVar15 = *(void **)((long)pbVar4 + lVar16 + -0xc);
          sVar17 = (size_t)*(int *)((long)pbVar4 + lVar16 + -4);
          uVar13 = sVar17 + local_78.l + 1;
          pcVar9 = local_78.s;
          if (uVar13 < local_78.m) {
LAB_0011e0ab:
            local_78.s = pcVar9;
            memcpy(local_78.s + local_78.l,pvVar15,sVar17);
            local_78.l = sVar17 + local_78.l;
            local_78.s[local_78.l] = '\0';
          }
          else {
            uVar13 = uVar13 >> 1 | uVar13;
            uVar13 = uVar13 >> 2 | uVar13;
            uVar13 = uVar13 >> 4 | uVar13;
            uVar13 = uVar13 >> 8 | uVar13;
            local_78.m = (uVar13 >> 0x10 | uVar13) + 1;
            local_60 = pvVar15;
            pcVar9 = (char *)realloc(local_78.s,local_78.m);
            pvVar15 = local_60;
            if (pcVar9 != (char *)0x0) goto LAB_0011e0ab;
          }
          uVar11 = *(uint *)((long)&pbVar4->key + lVar16);
          *(char **)((long)pbVar4 + lVar16 + -0xc) = local_78.s + (uVar11 & 0x7fffffff);
          *(uint *)((long)&pbVar4->key + lVar16) = uVar11 | 0x80000000;
          *(uint *)((long)pbVar4 + lVar16 + -0x1c) = uVar2;
          piVar8 = &(local_58->d).shared_dirty;
          *(byte *)piVar8 = (byte)*piVar8 | 8;
          pbVar18 = local_58;
        }
      }
      uVar20 = uVar20 + 1;
      uVar13 = *(ulong *)&pbVar18->field_0x10;
      lVar16 = lVar16 + 0x20;
    } while (uVar20 < (uVar13 & 0xffff));
  }
  if ((char)(uVar13 >> 0x20) != '\0') {
    lVar16 = 0x1c;
    uVar13 = 0;
    do {
      pbVar5 = (pbVar18->d).fmt;
      uVar11 = *(uint *)((long)pbVar5 + lVar16 + -0x1c);
      uVar2 = src_hdr->transl[0][(int)uVar11];
      if (-1 < (int)uVar2) {
        iVar7 = 3 - (uint)(uVar2 < 0x8000);
        if (uVar2 < 0x80) {
          iVar7 = 1;
        }
        bVar6 = uVar2 < 0x80;
        if (0x7f < uVar11) {
          bVar6 = 3 - (uint)(uVar11 < 0x8000) == iVar7;
        }
        if (bVar6) {
          *(uint *)((long)pbVar5 + lVar16 + -0x1c) = uVar2;
          lVar19 = *(long *)((long)pbVar5 + lVar16 + -0xc);
          uVar20 = (ulong)(*(uint *)((long)&pbVar5->id + lVar16) & 0x7fffffff);
          *(char *)((lVar19 - uVar20) + 1) = (char)uVar2;
          if (iVar7 != 1) {
            lVar21 = -uVar20;
            uVar14 = (undefined1)(uVar2 >> 8);
            if (iVar7 == 2) {
              *(undefined1 *)(lVar19 + 2 + lVar21) = uVar14;
            }
            else {
              *(undefined1 *)(lVar19 + 2 + lVar21) = uVar14;
              *(char *)(lVar19 + 3 + lVar21) = (char)(uVar2 >> 0x10);
              *(char *)(lVar19 + 4 + lVar21) = (char)(uVar2 >> 0x18);
            }
          }
        }
        else {
          if (*(int *)((long)&pbVar5->id + lVar16) < 0) {
            __assert_fail("!fmt->p_free",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                          ,0x946,"int bcf_translate(const bcf_hdr_t *, bcf_hdr_t *, bcf1_t *)");
          }
          local_78.l = 0;
          local_78.m = 0;
          local_78.s = (char *)0x0;
          bcf_enc_int1(&local_78,uVar2);
          bcf_enc_size(&local_78,*(int *)((long)pbVar5 + lVar16 + -0x18),
                       *(int *)((long)pbVar5 + lVar16 + -0x10));
          *(uint *)((long)&pbVar5->id + lVar16) =
               *(uint *)((long)&pbVar5->id + lVar16) & 0x80000000 | (uint)local_78.l & 0x7fffffff;
          pvVar15 = *(void **)((long)pbVar5 + lVar16 + -0xc);
          sVar17 = (size_t)*(int *)((long)pbVar5 + lVar16 + -4);
          uVar20 = sVar17 + local_78.l + 1;
          pcVar9 = local_78.s;
          if (uVar20 < local_78.m) {
LAB_0011e2be:
            local_78.s = pcVar9;
            memcpy(local_78.s + local_78.l,pvVar15,sVar17);
            local_78.l = sVar17 + local_78.l;
            local_78.s[local_78.l] = '\0';
          }
          else {
            uVar20 = uVar20 >> 1 | uVar20;
            uVar20 = uVar20 >> 2 | uVar20;
            uVar20 = uVar20 >> 4 | uVar20;
            uVar20 = uVar20 >> 8 | uVar20;
            local_78.m = (uVar20 >> 0x10 | uVar20) + 1;
            local_60 = pvVar15;
            pcVar9 = (char *)realloc(local_78.s,local_78.m);
            pvVar15 = local_60;
            if (pcVar9 != (char *)0x0) goto LAB_0011e2be;
          }
          uVar11 = *(uint *)((long)&pbVar5->id + lVar16);
          *(char **)((long)pbVar5 + lVar16 + -0xc) = local_78.s + (uVar11 & 0x7fffffff);
          *(uint *)((long)&pbVar5->id + lVar16) = uVar11 | 0x80000000;
          *(uint *)((long)pbVar5 + lVar16 + -0x1c) = uVar2;
          (local_58->d).indiv_dirty = 1;
          pbVar18 = local_58;
        }
      }
      uVar13 = uVar13 + 1;
      lVar16 = lVar16 + 0x20;
    } while (uVar13 < (byte)pbVar18->field_0x14);
  }
  return 0;
}

Assistant:

int bcf_translate(const bcf_hdr_t *dst_hdr, bcf_hdr_t *src_hdr, bcf1_t *line)
{
    int i;
    if ( line->errcode )
    {
        fprintf(stderr,"[%s:%d %s] Unchecked error (%d), exiting.\n", __FILE__,__LINE__,__FUNCTION__,line->errcode);
        exit(1);
    }
    if ( src_hdr->ntransl==-1 ) return 0;    // no need to translate, all tags have the same id
    if ( !src_hdr->ntransl )  // called for the first time, see what needs translating
    {
        int dict;
        for (dict=0; dict<2; dict++)    // BCF_DT_ID and BCF_DT_CTG
        {
            src_hdr->transl[dict] = (int*) malloc(src_hdr->n[dict]*sizeof(int));
            for (i=0; i<src_hdr->n[dict]; i++)
            {
                if ( !src_hdr->id[dict][i].key || !dst_hdr->id[dict][i].key )    // gap left after removed BCF header lines
                    src_hdr->transl[dict][i] = -1;
                else if ( i>=dst_hdr->n[dict] || strcmp(src_hdr->id[dict][i].key,dst_hdr->id[dict][i].key) )
                {
                    src_hdr->transl[dict][i] = bcf_hdr_id2int(dst_hdr,dict,src_hdr->id[dict][i].key);
                    src_hdr->ntransl++;
                }
                else
                    src_hdr->transl[dict][i] = -1;
            }
        }
        if ( !src_hdr->ntransl )
        {
            free(src_hdr->transl[0]); src_hdr->transl[0] = NULL;
            free(src_hdr->transl[1]); src_hdr->transl[1] = NULL;
            src_hdr->ntransl = -1;
        }
        if ( src_hdr->ntransl==-1 ) return 0;
    }
    bcf_unpack(line,BCF_UN_ALL);

    // CHROM
    if ( src_hdr->transl[BCF_DT_CTG][line->rid] >=0 ) line->rid = src_hdr->transl[BCF_DT_CTG][line->rid];

    // FILTER
    for (i=0; i<line->d.n_flt; i++)
    {
        int src_id = line->d.flt[i];
        if ( src_hdr->transl[BCF_DT_ID][src_id] >=0 )
            line->d.flt[i] = src_hdr->transl[BCF_DT_ID][src_id];
        line->d.shared_dirty |= BCF1_DIRTY_FLT;
    }

    // INFO
    for (i=0; i<line->n_info; i++)
    {
        int src_id = line->d.info[i].key;
        int dst_id = src_hdr->transl[BCF_DT_ID][src_id];
        if ( dst_id<0 ) continue;
        int src_size = src_id>>7 ? ( src_id>>15 ? BCF_BT_INT32 : BCF_BT_INT16) : BCF_BT_INT8;
        int dst_size = dst_id>>7 ? ( dst_id>>15 ? BCF_BT_INT32 : BCF_BT_INT16) : BCF_BT_INT8;
        if ( src_size==dst_size )   // can overwrite
        {
            line->d.info[i].key = dst_id;
            uint8_t *vptr = line->d.info[i].vptr - line->d.info[i].vptr_off;
            if ( dst_size==BCF_BT_INT8 ) { vptr[1] = (uint8_t)dst_id; }
            else if ( dst_size==BCF_BT_INT16 ) { *(uint16_t*)vptr = (uint16_t)dst_id; }
            else { *(uint32_t*)vptr = (uint32_t)dst_id; }
        }
        else    // must realloc
        {
            bcf_info_t *info = &line->d.info[i];
            assert( !info->vptr_free );
            kstring_t str = {0,0,0};
            bcf_enc_int1(&str, dst_id);
            bcf_enc_size(&str, info->len,info->type);
            info->vptr_off = str.l;
            kputsn((char*)info->vptr, info->vptr_len, &str);
            info->vptr = (uint8_t*)str.s + info->vptr_off;
            info->vptr_free = 1;
            info->key = dst_id;
            line->d.shared_dirty |= BCF1_DIRTY_INF;
        }
    }

    // FORMAT
    for (i=0; i<line->n_fmt; i++)
    {
        int src_id = line->d.fmt[i].id;
        int dst_id = src_hdr->transl[BCF_DT_ID][src_id];
        if ( dst_id<0 ) continue;
        int src_size = src_id>>7 ? ( src_id>>15 ? BCF_BT_INT32 : BCF_BT_INT16) : BCF_BT_INT8;
        int dst_size = dst_id>>7 ? ( dst_id>>15 ? BCF_BT_INT32 : BCF_BT_INT16) : BCF_BT_INT8;
        if ( src_size==dst_size )   // can overwrite
        {
            line->d.fmt[i].id = dst_id;
            uint8_t *p = line->d.fmt[i].p - line->d.fmt[i].p_off;    // pointer to the vector size (4bits) and BT type (4bits)
            if ( dst_size==BCF_BT_INT8 ) { p[1] = dst_id; }
            else if ( dst_size==BCF_BT_INT16 ) { uint8_t *x = (uint8_t*) &dst_id; p[1] = x[0]; p[2] = x[1]; }
            else { uint8_t *x = (uint8_t*) &dst_id; p[1] = x[0]; p[2] = x[1]; p[3] = x[2]; p[4] = x[3]; }
        }
        else    // must realloc
        {
            bcf_fmt_t *fmt = &line->d.fmt[i];
            assert( !fmt->p_free );
            kstring_t str = {0,0,0};
            bcf_enc_int1(&str, dst_id);
            bcf_enc_size(&str, fmt->n, fmt->type);
            fmt->p_off = str.l;
            kputsn((char*)fmt->p, fmt->p_len, &str);
            fmt->p = (uint8_t*)str.s + fmt->p_off;
            fmt->p_free = 1;
            fmt->id = dst_id;
            line->d.indiv_dirty = 1;
        }
    }
    return 0;
}